

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpBroker.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpBrokerSS::generateCLI(TcpBrokerSS *this)

{
  generateCLI(this);
  return;
}

Assistant:

std::shared_ptr<helicsCLI11App> TcpBrokerSS::generateCLI()
    {
        auto hApp = NetworkBroker::generateCLI();
        hApp->description("TCP Single Socket Broker arguments");
        hApp->add_option("--connections", connections, "target link connections");
        hApp->add_flag("--no_outgoing_connection",
                       no_outgoing_connections,
                       "disable outgoing connections")
            ->ignore_underscore();
        return hApp;
    }